

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void clusterRemoval(Mat *image,int threshold)

{
  _Rb_tree_header *p_Var1;
  iterator __begin5;
  long lVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  iterator __end5;
  Mat out;
  Mat temp;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> cluster;
  Mat local_180 [8];
  int local_178;
  int local_174;
  long local_170;
  long *local_138;
  Mat local_120 [8];
  int local_118;
  int local_114;
  long local_110;
  long *local_d8;
  _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  local_c0;
  Mat local_90 [96];
  
  cv::Mat::clone();
  cv::Mat::Mat(local_180,*(int *)(image + 8),*(int *)(image + 0xc),*(uint *)image & 0xfff);
  if (0 < local_174) {
    lVar2 = 0;
    do {
      if (0 < local_178) {
        lVar5 = 0;
        do {
          *(undefined1 *)(lVar2 + *local_138 * lVar5 + local_170) = 0;
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_178);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_174);
  }
  if (0 < local_114) {
    p_Var1 = &local_c0._M_impl.super__Rb_tree_header;
    lVar2 = 0;
    do {
      if (0 < local_118) {
        lVar5 = 0;
        do {
          if (*(char *)(lVar2 + *local_d8 * lVar5 + local_110) == -1) {
            cv::Mat::Mat(local_90,local_120);
            findCluster((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)&local_c0,
                        local_90,(int)lVar2,(int)lVar5);
            cv::Mat::~Mat(local_90);
            p_Var4 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var3 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
                p_Var1 && (ulong)(long)threshold <
                          local_c0._M_impl.super__Rb_tree_header._M_node_count) {
              do {
                *(undefined1 *)
                 ((long)(int)p_Var3[1]._M_color +
                 (long)*(int *)&p_Var3[1].field_0x4 * *local_138 + local_170) = 0xff;
                p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
                p_Var4 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
              } while ((_Rb_tree_header *)p_Var3 != p_Var1);
            }
            for (; (_Rb_tree_header *)p_Var4 != p_Var1;
                p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
              *(undefined1 *)
               ((long)(int)p_Var4[1]._M_color +
               (long)*(int *)&p_Var4[1].field_0x4 * *local_d8 + local_110) = 0;
            }
            std::
            _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
            ::~_Rb_tree(&local_c0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_118);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < local_114);
  }
  cv::Mat::operator=(image,local_180);
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat(local_120);
  return;
}

Assistant:

void clusterRemoval(cv::Mat & image, int threshold) {
	cv::Mat temp = image.clone();
	cv::Mat out = cv::Mat(image.rows, image.cols, image.type());
	for (int x = 0; x < out.cols; x++)
		for (int y = 0; y < out.rows; y++)
			out.at<uchar>(cv::Point(x, y)) = 0;
	for (int x = 0; x < temp.cols; x++) {
		for (int y = 0; y < temp.rows; y++) {
			if (temp.at<uchar>(cv::Point(x, y)) == UCHAR_MAX) {
				std::set<mPoint> cluster = findCluster(temp, x, y);
				if (cluster.size() > threshold) {
					for (auto point : cluster) {
						out.at<uchar>(point) = UCHAR_MAX;
					}
				}
				for (auto point : cluster) {
					temp.at<uchar>(point) = 0;
				}
			}
		}
	}
	image = out;
}